

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

void __thiscall Population::evolve(Population *this)

{
  double dVar1;
  long lVar2;
  DNA *dna1;
  DNA *dna2;
  ulong uVar3;
  vector<DNA,_std::allocator<DNA>_> new_population;
  DNA local_a0;
  DNA local_68;
  
  new_population.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  new_population.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  new_population.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (uVar3 = 0;
      lVar2 = (long)(this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
                    super__Vector_impl_data._M_start, uVar3 < (ulong)(lVar2 / 0x38);
      uVar3 = uVar3 + 1) {
    dVar1 = RandomProbability();
    dna1 = GetDNAWithProbability(this,dVar1);
    dVar1 = RandomProbability();
    dna2 = GetDNAWithProbability(this,dVar1);
    crossover(&local_a0,this,dna1,dna2);
    mutation(&local_68,this,&local_a0);
    std::vector<DNA,_std::allocator<DNA>_>::emplace_back<DNA>(&new_population,&local_68);
    std::
    _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
                 *)&local_68);
    std::
    _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
                 *)&local_a0);
  }
  std::vector<DNA,_std::allocator<DNA>_>::_M_move_assign
            (&this->population_,&new_population,lVar2 % 0x38);
  calcFitness(this);
  std::vector<DNA,_std::allocator<DNA>_>::~vector(&new_population);
  return;
}

Assistant:

void Population::evolve() {
    vector<DNA> new_population;

    for (int i = 0; i < population_.size(); ++i) {
        const DNA& dna1 = GetDNAWithProbability(RandomProbability());
        const DNA& dna2 = GetDNAWithProbability(RandomProbability());
        new_population.push_back(mutation(crossover(dna1, dna2)));
    }

    population_ = move(new_population);
    calcFitness();
}